

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityType.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::EntityType::EntityType
          (EntityType *this,EntityKind Kind,KUINT8 Domain,Country Country,KUINT8 Categoy,
          KUINT8 SubCategory,KUINT8 Specific,KUINT8 Extra)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00221f70;
  this->m_ui8EntityKind = (KUINT8)Kind;
  this->m_ui8Domain = Domain;
  this->m_ui16Country = (KUINT16)Country;
  this->m_ui8Category = Categoy;
  this->m_ui8SubCategory = SubCategory;
  this->m_ui8Specific = Specific;
  this->m_ui8Extra = Extra;
  return;
}

Assistant:

EntityType::EntityType( EntityKind Kind, KUINT8 Domain, Country Country, KUINT8 Categoy,
                        KUINT8 SubCategory, KUINT8 Specific, KUINT8 Extra ) :
    m_ui8EntityKind( Kind ),
    m_ui8Domain( Domain ),
    m_ui16Country( Country ),
    m_ui8Category( Categoy ),
    m_ui8SubCategory( SubCategory ),
    m_ui8Specific( Specific ),
    m_ui8Extra( Extra )
{
}